

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O2

sexp_conflict
sexp_arithmetic_shift
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict i,sexp_conflict count)

{
  char cVar1;
  sexp_conflict psVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  sexp_conflict psStack_60;
  sexp_conflict res;
  sexp_gc_var_t __sexp_gc_preserver1;
  
  res = (sexp_conflict)0x43e;
  __sexp_gc_preserver1.var = (sexp_conflict *)0x0;
  __sexp_gc_preserver1.next = (sexp_gc_var_t *)0x0;
  if (((ulong)count & 1) == 0) {
    psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,2,count);
    return psVar2;
  }
  if ((sexp_conflict)0x1 < count) {
    uVar12 = (long)count >> 1;
    bVar11 = (byte)uVar12;
    if (((ulong)i & 1) == 0) {
      if ((((ulong)i & 2) == 0) && (i->tag == 0xc)) {
        uVar3 = sexp_bignum_hi(i);
        if ((long)uVar12 < 0) {
          uVar12 = -uVar12;
          uVar10 = uVar12 >> 6;
          if ((long)uVar3 < (long)uVar10) {
            res = (sexp_conflict)((ulong)('\0' < (i->value).flonum_bits[0]) * 2 + -1);
          }
          else {
            res = (sexp_conflict)sexp_make_bignum(ctx,(uVar3 - uVar10) + 1);
            if ((((ulong)res & 3) != 0) || (res->tag != 0x13)) {
              bVar11 = (byte)uVar12 & 0x3f;
              (res->value).flonum_bits[0] = (i->value).flonum_bits[0];
              lVar5 = 0;
              lVar4 = uVar3 - uVar10;
              while (lVar6 = lVar4, 0 < lVar6) {
                *(ulong *)((long)&res->value + lVar6 * 8 + 8) =
                     (*(ulong *)((long)&i->value + lVar6 * 8 + uVar10 * 8 + 8) >> bVar11) + lVar5;
                lVar4 = lVar6 + -1;
                if ((uVar12 & 0x3f) != 0) {
                  lVar5 = *(long *)((long)&i->value + lVar6 * 8 + uVar10 * 8 + 8) <<
                          (0x40 - bVar11 & 0x3f);
                }
              }
              if ((res->value).flonum_bits[0] < '\0') {
                res = (sexp_conflict)sexp_bignum_fxadd(ctx,res,1);
              }
            }
          }
        }
        else {
          uVar10 = uVar12 >> 6;
          res = (sexp_conflict)sexp_make_bignum(ctx,uVar3 + uVar10 + 1);
          if ((((ulong)res & 3) != 0) || (res->tag != 0x13)) {
            (res->value).flonum_bits[0] = (i->value).flonum_bits[0];
            uVar7 = 0;
            uVar9 = uVar3;
            if ((long)uVar3 < 1) {
              uVar9 = uVar7;
            }
            for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
              *(ulong *)((long)&res->value + uVar8 * 8 + uVar10 * 8 + 0x10) =
                   (*(long *)((long)&i->value + uVar8 * 8 + 0x10) << (bVar11 & 0x3f)) + uVar7;
              if ((uVar12 & 0x3f) != 0) {
                uVar7 = *(ulong *)((long)&i->value + uVar8 * 8 + 0x10) >>
                        (0x40 - (bVar11 & 0x3f) & 0x3f);
              }
            }
            if ((uVar12 & 0x3f) != 0) {
              *(ulong *)((long)&res->value + (uVar3 + uVar10) * 8 + 0x10) = uVar7;
            }
          }
        }
      }
      else {
        res = (sexp_conflict)sexp_type_exception(ctx,self,2,i);
      }
    }
    else {
      uVar3 = (long)i >> 1;
      if ((long)uVar12 < 0) {
        if (uVar12 < 0xffffffffffffffc1) {
          psStack_60 = (sexp_conflict)0x1;
          res = psStack_60;
        }
        else {
          res = (sexp_conflict)(((long)uVar3 >> (-bVar11 & 0x3f)) * 2 + 1);
        }
      }
      else {
        lVar4 = -1;
        do {
          lVar5 = 0x40;
          if (lVar4 == 0x3f) break;
          cVar1 = (char)lVar4;
          lVar5 = lVar4 + 1;
          lVar4 = lVar5;
        } while (uVar3 >> (cVar1 + 2U & 0x3f) != 0);
        if (uVar12 + lVar5 + 1 < 0x3f) {
          res = (sexp_conflict)
                (((long)i >> 0x3e & 0xfffffffffffffffcU | 2) * (uVar3 << (bVar11 & 0x3f)) + 1);
        }
        else {
          __sexp_gc_preserver1.var = &res;
          __sexp_gc_preserver1.next = (ctx->value).context.saves;
          (ctx->value).context.saves = &__sexp_gc_preserver1;
          res = (sexp_conflict)sexp_fixnum_to_bignum(ctx,i);
          res = sexp_arithmetic_shift(ctx,self,n,res,count);
          (ctx->value).context.saves = __sexp_gc_preserver1.next;
        }
      }
    }
    i = (sexp_conflict)sexp_bignum_normalize(res);
  }
  return i;
}

Assistant:

sexp sexp_arithmetic_shift (sexp ctx, sexp self, sexp_sint_t n, sexp i, sexp count) {
  sexp_uint_t tmp;
  sexp_sint_t c;
#if SEXP_USE_BIGNUMS
  sexp_sint_t len, offset, bit_shift, tail_shift, j;
  sexp_gc_var1(res);
#else
  sexp res;
#endif
  if (! sexp_fixnump(count))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, count);
  c = sexp_unbox_fixnum(count);
  if (c == 0) return i;
  if (sexp_fixnump(i)) {
    if (c < 0) {
      res = sexp_make_fixnum(c > -sizeof(sexp_sint_t)*CHAR_BIT ? sexp_unbox_fixnum(i) >> -c : 0);
    } else {
#if SEXP_USE_BIGNUMS
      if ((log2i(sexp_unbox_fixnum(i)) + c + 1)
          < (sizeof(sexp_uint_t)*CHAR_BIT - SEXP_FIXNUM_BITS)) {
#endif
        tmp = (sexp_uint_t)sexp_unbox_fixnum(i) << c;
        res = sexp_make_fixnum(tmp * sexp_fx_sign(i));
#if SEXP_USE_BIGNUMS
      } else {
        sexp_gc_preserve1(ctx, res);
        res = sexp_fixnum_to_bignum(ctx, i);
        res = sexp_arithmetic_shift(ctx, self, n, res, count);
        sexp_gc_release1(ctx);
      }
#endif
    }
#if SEXP_USE_BIGNUMS
  } else if (sexp_bignump(i)) {
    len = sexp_bignum_hi(i);
    if (c < 0) {
      c = -c;
      offset = c / (sizeof(sexp_uint_t)*CHAR_BIT);
      bit_shift = c - offset*(sizeof(sexp_uint_t)*CHAR_BIT);
      if (len < offset) {
        res = sexp_make_fixnum(sexp_bignum_sign(i) > 0 ? 0 : -1);
      } else {
        res = sexp_make_bignum(ctx, len - offset + 1);
        if (!sexp_exceptionp(res)) {
          sexp_bignum_sign(res) = sexp_bignum_sign(i);
          for (j=len-offset-1, tmp=0; j>=0; j--) {
            sexp_bignum_data(res)[j]
              = (sexp_bignum_data(i)[j+offset] >> bit_shift)+ tmp;
            if (bit_shift != 0)
              tmp = sexp_bignum_data(i)[j+offset]
                << (sizeof(sexp_uint_t)*CHAR_BIT-bit_shift);
          }
          if (sexp_bignum_sign(res) < 0)
            res = sexp_bignum_fxadd(ctx, res, 1);
        }
      }
    } else {
      offset = c / (sizeof(sexp_uint_t)*CHAR_BIT);
      bit_shift = c - offset*(sizeof(sexp_uint_t)*CHAR_BIT);
      tail_shift = (sizeof(sexp_uint_t)*CHAR_BIT-bit_shift);
      res = sexp_make_bignum(ctx, len + offset + 1);
      if (!sexp_exceptionp(res)) {
        sexp_bignum_sign(res) = sexp_bignum_sign(i);
        for (j=tmp=0; j<len; j++) {
          sexp_bignum_data(res)[j+offset]
            = (sexp_bignum_data(i)[j] << bit_shift) + tmp;
          if (bit_shift != 0)
            tmp = sexp_bignum_data(i)[j] >> tail_shift;
        }
        if (bit_shift != 0) sexp_bignum_data(res)[len+offset] = tmp;
      }
    }
#endif
  } else {
    res = sexp_type_exception(ctx, self, SEXP_FIXNUM, i);
  }
  return sexp_bignum_normalize(res);
}